

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::visit_null
          (basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          semantic_tag tag,ser_context *param_3,error_code *ec)

{
  bool bVar1;
  undefined8 in_RCX;
  bson_errc __e;
  error_code *in_RDX;
  char in_SIL;
  uint8_t in_stack_0000008f;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000090;
  
  __e = (bson_errc)((ulong)in_RCX >> 0x20);
  bVar1 = std::
          vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                   *)in_RDX);
  if (bVar1) {
    std::error_code::operator=(in_RDX,__e);
  }
  else if (in_SIL == '\r') {
    before_value(in_stack_00000090,in_stack_0000008f);
  }
  else {
    before_value(in_stack_00000090,in_stack_0000008f);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }
        switch (tag)
        {
            case semantic_tag::undefined:
                before_value(jsoncons::bson::bson_type::undefined_type);
                break;
            default:
                before_value(jsoncons::bson::bson_type::null_type);
                break;
        }
        JSONCONS_VISITOR_RETURN;
    }